

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void jpgd::jpeg_decoder::decode_block_ac_refine
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  jpgd_block_t *pjVar6;
  short *psVar7;
  jpgd_block_t *this_coef_1;
  jpgd_block_t *this_coef;
  jpgd_block_t *p;
  int m1;
  int p1;
  int r;
  int k;
  int s;
  int block_y_local;
  int block_x_local;
  int component_id_local;
  jpeg_decoder *pD_local;
  
  uVar2 = 1 << ((byte)pD->m_successive_low & 0x1f);
  iVar3 = -1 << ((byte)pD->m_successive_low & 0x1f);
  pjVar6 = coeff_buf_getp(pD,pD->m_ac_coeffs[component_id],block_x,block_y);
  if (0x3f < pD->m_spectral_end) {
    __assert_fail("pD->m_spectral_end <= 63",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/jpgd.cpp"
                  ,0xa7b,
                  "static void jpgd::jpeg_decoder::decode_block_ac_refine(jpeg_decoder *, int, int, int)"
                 );
  }
  p1 = pD->m_spectral_start;
  sVar1 = (short)iVar3;
  if (pD->m_eob_run == 0) {
    for (; p1 <= pD->m_spectral_end; p1 = p1 + 1) {
      uVar4 = huff_decode(pD,pD->m_pHuff_tabs[pD->m_comp_ac_tab[component_id]]);
      m1 = (int)uVar4 >> 4;
      if ((uVar4 & 0xf) == 0) {
        if (m1 != 0xf) {
          pD->m_eob_run = 1 << ((byte)m1 & 0x1f);
          if (m1 != 0) {
            uVar5 = get_bits_no_markers(pD,m1);
            pD->m_eob_run = uVar5 + pD->m_eob_run;
          }
          break;
        }
        r = 0;
      }
      else {
        if ((uVar4 & 0xf) != 1) {
          stop_decoding(pD,JPGD_DECODE_ERROR);
        }
        uVar5 = get_bits_no_markers(pD,1);
        r = iVar3;
        if (uVar5 != 0) {
          r = uVar2;
        }
      }
      do {
        psVar7 = pjVar6 + *(int *)(g_ZAG + (long)(int)(p1 & 0x3f) * 4);
        if (*psVar7 == 0) {
          m1 = m1 + -1;
          if (m1 < 0) break;
        }
        else {
          uVar5 = get_bits_no_markers(pD,1);
          if ((uVar5 != 0) && (((int)*psVar7 & uVar2) == 0)) {
            if (*psVar7 < 0) {
              *psVar7 = *psVar7 + sVar1;
            }
            else {
              *psVar7 = *psVar7 + (short)uVar2;
            }
          }
        }
        p1 = p1 + 1;
      } while (p1 <= pD->m_spectral_end);
      if ((r != 0) && (p1 < 0x40)) {
        pjVar6[*(int *)(g_ZAG + (long)p1 * 4)] = (jpgd_block_t)r;
      }
    }
  }
  if (0 < pD->m_eob_run) {
    for (; p1 <= pD->m_spectral_end; p1 = p1 + 1) {
      psVar7 = pjVar6 + *(int *)(g_ZAG + (long)(int)(p1 & 0x3f) * 4);
      if (((*psVar7 != 0) && (uVar5 = get_bits_no_markers(pD,1), uVar5 != 0)) &&
         (((int)*psVar7 & uVar2) == 0)) {
        if (*psVar7 < 0) {
          *psVar7 = *psVar7 + sVar1;
        }
        else {
          *psVar7 = *psVar7 + (short)uVar2;
        }
      }
    }
    pD->m_eob_run = pD->m_eob_run + -1;
  }
  return;
}

Assistant:

void jpeg_decoder::decode_block_ac_refine(jpeg_decoder *pD, int component_id, int block_x, int block_y)
{
  int s, k, r;
  int p1 = 1 << pD->m_successive_low;
  int m1 = (-1) << pD->m_successive_low;
  jpgd_block_t *p = pD->coeff_buf_getp(pD->m_ac_coeffs[component_id], block_x, block_y);
  
  JPGD_ASSERT(pD->m_spectral_end <= 63);
  
  k = pD->m_spectral_start;
  
  if (pD->m_eob_run == 0)
  {
    for ( ; k <= pD->m_spectral_end; k++)
    {
      s = pD->huff_decode(pD->m_pHuff_tabs[pD->m_comp_ac_tab[component_id]]);

      r = s >> 4;
      s &= 15;

      if (s)
      {
        if (s != 1)
          pD->stop_decoding(JPGD_DECODE_ERROR);

        if (pD->get_bits_no_markers(1))
          s = p1;
        else
          s = m1;
      }
      else
      {
        if (r != 15)
        {
          pD->m_eob_run = 1 << r;

          if (r)
            pD->m_eob_run += pD->get_bits_no_markers(r);

          break;
        }
      }

      do
      {
        jpgd_block_t *this_coef = p + g_ZAG[k & 63];

        if (*this_coef != 0)
        {
          if (pD->get_bits_no_markers(1))
          {
            if ((*this_coef & p1) == 0)
            {
              if (*this_coef >= 0)
                *this_coef = static_cast<jpgd_block_t>(*this_coef + p1);
              else
                *this_coef = static_cast<jpgd_block_t>(*this_coef + m1);
            }
          }
        }
        else
        {
          if (--r < 0)
            break;
        }

        k++;

      } while (k <= pD->m_spectral_end);

      if ((s) && (k < 64))
      {
        p[g_ZAG[k]] = static_cast<jpgd_block_t>(s);
      }
    }
  }

  if (pD->m_eob_run > 0)
  {
    for ( ; k <= pD->m_spectral_end; k++)
    {
      jpgd_block_t *this_coef = p + g_ZAG[k & 63]; // logical AND to shut up static code analysis

      if (*this_coef != 0)
      {
        if (pD->get_bits_no_markers(1))
        {
          if ((*this_coef & p1) == 0)
          {
            if (*this_coef >= 0)
              *this_coef = static_cast<jpgd_block_t>(*this_coef + p1);
            else
              *this_coef = static_cast<jpgd_block_t>(*this_coef + m1);
          }
        }
      }
    }

    pD->m_eob_run--;
  }
}